

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdiarea.cpp
# Opt level: O0

QSize __thiscall QMdiArea::sizeHint(QMdiArea *this)

{
  bool bVar1;
  int iVar2;
  QMdiArea *pQVar3;
  const_iterator o;
  QMdiSubWindow *pQVar4;
  QSize *in_RDI;
  long in_FS_OFFSET;
  QMdiSubWindow *child;
  QList<QPointer<QMdiSubWindow>_> *__range1;
  int scaleFactor;
  QWidget *widget;
  int nestedCount;
  const_iterator __end1;
  const_iterator __begin1;
  QSize desktopSize;
  QSize size;
  char *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  QWidget *local_58;
  int local_4c;
  const_iterator local_20;
  undefined1 *local_18;
  QSize local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_4c = 0;
  local_58 = QWidget::parentWidget((QWidget *)0x613098);
  while (local_58 != (QWidget *)0x0) {
    pQVar3 = qobject_cast<QMdiArea*>((QObject *)0x6130af);
    if (pQVar3 != (QMdiArea *)0x0) {
      local_4c = local_4c + 1;
    }
    local_58 = QWidget::parentWidget((QWidget *)0x6130ca);
  }
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  QGuiApplication::primaryScreen();
  local_18 = (undefined1 *)QScreen::virtualSize();
  local_10 = (QSize)&DAT_aaaaaaaaaaaaaaaa;
  iVar2 = QSize::width((QSize *)0x613113);
  iVar2 = (iVar2 << 1) / ((local_4c + 1) * 3);
  QSize::height((QSize *)0x613128);
  QSize::QSize((QSize *)CONCAT44(iVar2,in_stack_ffffffffffffff80),
               (int)((ulong)in_stack_ffffffffffffff78 >> 0x20),(int)in_stack_ffffffffffffff78);
  d_func((QMdiArea *)0x613158);
  local_20.i = (QPointer<QMdiSubWindow> *)&DAT_aaaaaaaaaaaaaaaa;
  local_20 = QList<QPointer<QMdiSubWindow>_>::begin
                       ((QList<QPointer<QMdiSubWindow>_> *)CONCAT44(iVar2,in_stack_ffffffffffffff80)
                       );
  o = QList<QPointer<QMdiSubWindow>_>::end
                ((QList<QPointer<QMdiSubWindow>_> *)CONCAT44(iVar2,in_stack_ffffffffffffff80));
  while (bVar1 = QList<QPointer<QMdiSubWindow>_>::const_iterator::operator!=(&local_20,o), bVar1) {
    QList<QPointer<QMdiSubWindow>_>::const_iterator::operator*(&local_20);
    pQVar4 = ::QPointer::operator_cast_to_QMdiSubWindow_((QPointer<QMdiSubWindow> *)0x6131ca);
    bVar1 = sanityCheck((QMdiSubWindow *)CONCAT44(iVar2,in_stack_ffffffffffffff80),
                        in_stack_ffffffffffffff78);
    if (bVar1) {
      (**(code **)(*(long *)&pQVar4->super_QWidget + 0x70))();
      local_10 = QSize::expandedTo(in_RDI,(QSize *)CONCAT44(iVar2,in_stack_ffffffffffffff80));
    }
    QList<QPointer<QMdiSubWindow>_>::const_iterator::operator++(&local_20);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_10;
}

Assistant:

QSize QMdiArea::sizeHint() const
{
    // Calculate a proper scale factor for the desktop's size.
    // This also takes into account that we can have nested workspaces.
    int nestedCount = 0;
    QWidget *widget = this->parentWidget();
    while (widget) {
        if (qobject_cast<QMdiArea *>(widget))
            ++nestedCount;
        widget = widget->parentWidget();
    }
    const int scaleFactor = 3 * (nestedCount + 1);

    QSize desktopSize = QGuiApplication::primaryScreen()->virtualSize();
    QSize size(desktopSize.width() * 2 / scaleFactor, desktopSize.height() * 2 / scaleFactor);
    for (QMdiSubWindow *child : d_func()->childWindows) {
        if (!sanityCheck(child, "QMdiArea::sizeHint"))
            continue;
        size = size.expandedTo(child->sizeHint());
    }
    return size;
}